

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txmempool.cpp
# Opt level: O2

void CheckMempoolTRUCInvariants(CTxMemPool *tx_pool)

{
  CTxMemPoolEntry *this;
  int32_t iVar1;
  CTxMemPoolEntry **ppCVar2;
  _Base_ptr p_Var3;
  pointer pTVar4;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock8;
  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> local_78;
  bool local_61;
  vector<TxMempoolInfo,_std::allocator<TxMempoolInfo>_> local_60;
  unique_lock<std::recursive_mutex> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&local_48,&tx_pool->cs,
             "tx_pool.cs",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/txmempool.cpp"
             ,0x92,false);
  CTxMemPool::infoAll(&local_60,tx_pool);
  for (pTVar4 = local_60.super__Vector_base<TxMempoolInfo,_std::allocator<TxMempoolInfo>_>._M_impl.
                super__Vector_impl_data._M_start;
      pTVar4 != local_60.super__Vector_base<TxMempoolInfo,_std::allocator<TxMempoolInfo>_>._M_impl.
                super__Vector_impl_data._M_finish; pTVar4 = pTVar4 + 1) {
    local_78._M_ptr =
         (element_type *)
         CTxMemPool::GetEntry
                   (tx_pool,&((pTVar4->tx).
                              super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->hash);
    ppCVar2 = inline_assertion_check<true,CTxMemPoolEntry_const*>
                        ((CTxMemPoolEntry **)&local_78,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/txmempool.cpp"
                         ,0x94,"CheckMempoolTRUCInvariants",
                         "tx_pool.GetEntry(tx_info.tx->GetHash())");
    this = *ppCVar2;
    if (((pTVar4->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        version == 3) {
      iVar1 = CTxMemPoolEntry::GetTxSize(this);
      local_78._M_ptr._0_1_ = iVar1 < 0x2711;
      inline_assertion_check<true,bool>
                ((bool *)&local_78,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/txmempool.cpp"
                 ,0x97,"CheckMempoolTRUCInvariants","entry.GetTxSize() <= TRUC_MAX_VSIZE");
      local_78._M_ptr._0_1_ = (ulong)this->m_count_with_descendants < 3;
      inline_assertion_check<true,bool>
                ((bool *)&local_78,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/txmempool.cpp"
                 ,0x9a,"CheckMempoolTRUCInvariants",
                 "entry.GetCountWithDescendants() <= TRUC_DESCENDANT_LIMIT");
      local_78._M_ptr._0_1_ = (ulong)this->m_count_with_ancestors < 3;
      inline_assertion_check<true,bool>
                ((bool *)&local_78,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/txmempool.cpp"
                 ,0x9b,"CheckMempoolTRUCInvariants",
                 "entry.GetCountWithAncestors() <= TRUC_ANCESTOR_LIMIT");
      local_78._M_ptr._0_1_ = this->nSizeWithDescendants < 0x2af9;
      inline_assertion_check<true,bool>
                ((bool *)&local_78,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/txmempool.cpp"
                 ,0x9c,"CheckMempoolTRUCInvariants",
                 "entry.GetSizeWithDescendants() <= TRUC_MAX_VSIZE + TRUC_CHILD_MAX_VSIZE");
      local_78._M_ptr =
           (element_type *)CONCAT71(local_78._M_ptr._1_7_,this->nSizeWithAncestors < 0x2af9);
      inline_assertion_check<true,bool>
                ((bool *)&local_78,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/txmempool.cpp"
                 ,0x9d,"CheckMempoolTRUCInvariants",
                 "entry.GetSizeWithAncestors() <= TRUC_MAX_VSIZE + TRUC_CHILD_MAX_VSIZE");
      if (1 < (ulong)this->m_count_with_ancestors) {
        iVar1 = CTxMemPoolEntry::GetTxSize(this);
        local_78._M_ptr = (element_type *)CONCAT71(local_78._M_ptr._1_7_,iVar1 < 0x3e9);
        inline_assertion_check<true,bool>
                  ((bool *)&local_78,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/txmempool.cpp"
                   ,0xa1,"CheckMempoolTRUCInvariants","entry.GetTxSize() <= TRUC_CHILD_MAX_VSIZE");
        std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_78,
                   *(__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> **)
                    ((this->m_parents)._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 1));
        local_61 = *(int *)&(((Parents *)((long)local_78._M_ptr + 0x10))->_M_t)._M_impl.
                            super__Rb_tree_header._M_header._M_right == 3;
        inline_assertion_check<true,bool>
                  (&local_61,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/txmempool.cpp"
                   ,0xa4,"CheckMempoolTRUCInvariants",
                   "parents.begin()->get().GetSharedTx()->version == TRUC_VERSION");
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
      }
    }
    else if (1 < (ulong)this->m_count_with_ancestors) {
      for (p_Var3 = (this->m_parents)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var3 != &(this->m_parents)._M_t._M_impl.super__Rb_tree_header;
          p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
        std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_78,
                   *(__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> **)(p_Var3 + 1));
        local_61 = *(int *)&(((Parents *)((long)local_78._M_ptr + 0x10))->_M_t)._M_impl.
                            super__Rb_tree_header._M_header._M_right != 3;
        inline_assertion_check<true,bool>
                  (&local_61,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/txmempool.cpp"
                   ,0xa9,"CheckMempoolTRUCInvariants",
                   "parent.get().GetSharedTx()->version != TRUC_VERSION");
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
      }
    }
  }
  std::vector<TxMempoolInfo,_std::allocator<TxMempoolInfo>_>::~vector(&local_60);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CheckMempoolTRUCInvariants(const CTxMemPool& tx_pool)
{
    LOCK(tx_pool.cs);
    for (const auto& tx_info : tx_pool.infoAll()) {
        const auto& entry = *Assert(tx_pool.GetEntry(tx_info.tx->GetHash()));
        if (tx_info.tx->version == TRUC_VERSION) {
            // Check that special maximum virtual size is respected
            Assert(entry.GetTxSize() <= TRUC_MAX_VSIZE);

            // Check that special TRUC ancestor/descendant limits and rules are always respected
            Assert(entry.GetCountWithDescendants() <= TRUC_DESCENDANT_LIMIT);
            Assert(entry.GetCountWithAncestors() <= TRUC_ANCESTOR_LIMIT);
            Assert(entry.GetSizeWithDescendants() <= TRUC_MAX_VSIZE + TRUC_CHILD_MAX_VSIZE);
            Assert(entry.GetSizeWithAncestors() <= TRUC_MAX_VSIZE + TRUC_CHILD_MAX_VSIZE);

            // If this transaction has at least 1 ancestor, it's a "child" and has restricted weight.
            if (entry.GetCountWithAncestors() > 1) {
                Assert(entry.GetTxSize() <= TRUC_CHILD_MAX_VSIZE);
                // All TRUC transactions must only have TRUC unconfirmed parents.
                const auto& parents = entry.GetMemPoolParentsConst();
                Assert(parents.begin()->get().GetSharedTx()->version == TRUC_VERSION);
            }
        } else if (entry.GetCountWithAncestors() > 1) {
            // All non-TRUC transactions must only have non-TRUC unconfirmed parents.
            for (const auto& parent : entry.GetMemPoolParentsConst()) {
                Assert(parent.get().GetSharedTx()->version != TRUC_VERSION);
            }
        }
    }
}